

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::insert
          (QMovableArrayOps<QVariant> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_70;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_48,t);
  bVar3 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
  QArrayDataPointer<QVariant>::detachAndGrow
            ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar3),n,(QVariant **)0x0,
             (QArrayDataPointer<QVariant> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      do {
        ::QVariant::QVariant
                  ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr +
                   -1,(QVariant *)&local_48);
        ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
        *pqVar2 = *pqVar2 + 1;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    local_70.displaceFrom =
         (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr + i;
    local_70.displaceTo = local_70.displaceFrom + n;
    local_70.bytes =
         ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size - i) *
         0x20;
    local_70.data = (QArrayDataPointer<QVariant> *)this;
    local_70.nInserts = n;
    memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
    if (n != 0) {
      do {
        ::QVariant::QVariant(local_70.displaceFrom,(QVariant *)&local_48);
        local_70.displaceFrom = local_70.displaceFrom + 1;
        n = n + -1;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_70);
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }